

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_utf8.c
# Opt level: O2

void t45(void)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  void *pvVar5;
  
  uVar3 = al_ustr_new("abcdef");
  uVar4 = al_ustr_new("ABCDEF");
  cVar1 = al_ustr_replace_range(uVar3,0xffffffffffffffff,1,uVar4);
  if (cVar1 == '\0') {
    log_printf("OK   %s\n","! al_ustr_replace_range(us1, -1, 1, us2)");
  }
  else {
    log_printf("FAIL %s\n","! al_ustr_replace_range(us1, -1, 1, us2)");
    error = error + 1;
  }
  cVar1 = al_ustr_replace_range(uVar3,8,100,uVar4);
  if (cVar1 == '\0') {
    log_printf("FAIL %s\n","al_ustr_replace_range(us1, 8, 100, us2)");
    error = error + 1;
  }
  else {
    log_printf("OK   %s\n","al_ustr_replace_range(us1, 8, 100, us2)");
  }
  pvVar5 = (void *)al_cstr(uVar3);
  iVar2 = bcmp(pvVar5,"abcdef",0xf);
  if (iVar2 == 0) {
    log_printf("OK   %s\n","0 == memcmp(al_cstr(us1), \"abcdef\\0\\0ABCDEF\", 15)");
  }
  else {
    log_printf("FAIL %s\n","0 == memcmp(al_cstr(us1), \"abcdef\\0\\0ABCDEF\", 15)");
    error = error + 1;
  }
  cVar1 = al_ustr_replace_range(uVar3,8,1,uVar4);
  if (cVar1 == '\0') {
    log_printf("OK   %s\n","! al_ustr_replace_range(us1, 8, 1, us2)");
  }
  else {
    log_printf("FAIL %s\n","! al_ustr_replace_range(us1, 8, 1, us2)");
    error = error + 1;
  }
  pvVar5 = (void *)al_cstr(uVar3);
  iVar2 = bcmp(pvVar5,"abcdef",0xf);
  if (iVar2 == 0) {
    log_printf("OK   %s\n","0 == memcmp(al_cstr(us1), \"abcdef\\0\\0ABCDEF\", 15)");
  }
  else {
    log_printf("FAIL %s\n","0 == memcmp(al_cstr(us1), \"abcdef\\0\\0ABCDEF\", 15)");
    error = error + 1;
  }
  al_ustr_free(uVar3);
  al_ustr_free(uVar4);
  return;
}

Assistant:

static void t45(void)
{
   ALLEGRO_USTR *us1 = al_ustr_new("abcdef");
   ALLEGRO_USTR *us2 = al_ustr_new("ABCDEF");

   /* Start1 < 0 [not allowed] */
   CHECK(! al_ustr_replace_range(us1, -1, 1, us2));

   /* Start1 > end(us1) [padded] */
   CHECK(al_ustr_replace_range(us1, 8, 100, us2));
   CHECK(0 == memcmp(al_cstr(us1), "abcdef\0\0ABCDEF", 15));

   /* Start1 > end1 [not allowed] */
   CHECK(! al_ustr_replace_range(us1, 8, 1, us2));
   CHECK(0 == memcmp(al_cstr(us1), "abcdef\0\0ABCDEF", 15));

   al_ustr_free(us1);
   al_ustr_free(us2);
}